

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Variable __thiscall LiteScript::_Type_STRING::OAdd(_Type_STRING *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  String *pSVar4;
  String *pSVar5;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar6;
  Variable VVar7;
  String local_98;
  undefined1 local_71;
  String local_70;
  undefined1 local_49;
  undefined4 local_48;
  undefined1 local_38 [8];
  Variable tmp;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_STRING *this_local;
  Variable *res;
  
  tmp.nb_ref = (uint *)in_RCX;
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(pTVar3,(Type *)obj1);
  if (bVar1) {
    Variable::Convert((Variable *)local_38,(Type *)tmp.nb_ref);
    pOVar2 = Variable::operator->((Variable *)local_38);
    pTVar3 = Object::GetType(pOVar2);
    bVar1 = Type::operator!=(pTVar3,(Type *)obj1);
    if (bVar1) {
      pOVar2 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    }
    else {
      local_49 = 0;
      pOVar2 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      pOVar2 = Variable::operator->(obj2);
      pSVar4 = Object::GetData<LiteScript::String>(pOVar2);
      pOVar2 = Variable::operator->((Variable *)local_38);
      pSVar5 = Object::GetData<LiteScript::String>(pOVar2);
      String::operator+(&local_70,pSVar4,pSVar5);
      pOVar2 = Variable::operator->((Variable *)this);
      pSVar4 = Object::GetData<LiteScript::String>(pOVar2);
      String::operator=(pSVar4,&local_70);
      String::~String(&local_70);
      local_49 = 1;
    }
    local_48 = 1;
    Variable::~Variable((Variable *)local_38);
    puVar6 = extraout_RDX;
  }
  else {
    local_71 = 0;
    pOVar2 = Variable::operator->(obj2);
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    pOVar2 = Variable::operator->(obj2);
    pSVar4 = Object::GetData<LiteScript::String>(pOVar2);
    pOVar2 = Variable::operator->((Variable *)tmp.nb_ref);
    pSVar5 = Object::GetData<LiteScript::String>(pOVar2);
    String::operator+(&local_98,pSVar4,pSVar5);
    pOVar2 = Variable::operator->((Variable *)this);
    pSVar4 = Object::GetData<LiteScript::String>(pOVar2);
    String::operator=(pSVar4,&local_98);
    String::~String(&local_98);
    puVar6 = extraout_RDX_00;
  }
  VVar7.nb_ref = puVar6;
  VVar7.obj = (Object *)this;
  return VVar7;
}

Assistant:

LiteScript::Variable LiteScript::_Type_STRING::OAdd(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != *this) {
        Variable tmp = obj2.Convert(*this);
        if (tmp->GetType() != *this)
            return obj1->memory.Create(Type::NIL);
        Variable res = obj1->memory.Create(Type::STRING);
        res->GetData<String>() = obj1->GetData<String>() + tmp->GetData<String>();
        return res;
    }
    Variable res = obj1->memory.Create(Type::STRING);
    res->GetData<String>() = obj1->GetData<String>() + obj2->GetData<String>();
    return res;
}